

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

bool __thiscall
BVSparse<Memory::JitArenaAllocator>::Equal
          (BVSparse<Memory::JitArenaAllocator> *this,BVSparse<Memory::JitArenaAllocator> *bv)

{
  bool bVar1;
  bool local_3a;
  bool local_39;
  Type_conflict local_30;
  BVSparseNode *bvNode2;
  BVSparseNode *bvNode1;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  BVSparse<Memory::JitArenaAllocator> *this_local;
  
  bvNode2 = this->head;
  local_30 = bv->head;
  while( true ) {
    while( true ) {
      local_39 = false;
      if (bvNode2 != (BVSparseNode *)0x0) {
        local_39 = BVUnitT<unsigned_long>::IsEmpty(&bvNode2->data);
      }
      if (local_39 == false) break;
      bvNode2 = bvNode2->next;
    }
    while( true ) {
      local_3a = false;
      if (local_30 != (Type_conflict)0x0) {
        local_3a = BVUnitT<unsigned_long>::IsEmpty(&local_30->data);
      }
      if (local_3a == false) break;
      local_30 = local_30->next;
    }
    if (bvNode2 == (BVSparseNode *)0x0) {
      return local_30 == (Type_conflict)0x0;
    }
    if (local_30 == (Type_conflict)0x0) {
      return false;
    }
    if (bvNode2->startIndex != local_30->startIndex) break;
    bVar1 = BVUnitT<unsigned_long>::Equal
                      (&bvNode2->data,(BVUnitT<unsigned_long>)(local_30->data).word);
    if (!bVar1) {
      return false;
    }
    bvNode2 = bvNode2->next;
    local_30 = local_30->next;
  }
  return false;
}

Assistant:

bool
BVSparse<TAllocator>::Equal(BVSparse const * bv) const
{
    BVSparseNode const * bvNode1 = this->head;
    BVSparseNode const * bvNode2 = bv->head;

    while (true)
    {
        while (bvNode1 != nullptr && bvNode1->data.IsEmpty())
        {
            bvNode1 = bvNode1->next;
        }
        while (bvNode2 != nullptr && bvNode2->data.IsEmpty())
        {
            bvNode2 = bvNode2->next;
        }
        if (bvNode1 == nullptr)
        {
            return (bvNode2 == nullptr);
        }
        if (bvNode2 == nullptr)
        {
            return false;
        }
        if (bvNode1->startIndex != bvNode2->startIndex)
        {
            return false;
        }
        if (!bvNode1->data.Equal(bvNode2->data))
        {
            return false;
        }
        bvNode1 = bvNode1->next;
        bvNode2 = bvNode2->next;
    }
}